

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PInt::PInt(PInt *this)

{
  PSymbolConstNumeric *pPVar1;
  FName local_20;
  FName local_1c;
  
  PBasicType::PBasicType((PBasicType *)this,4,4);
  *(undefined ***)this = &PTR_StaticType_007c77c0;
  this->Unsigned = false;
  pPVar1 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
  local_1c.Index = 0x23a;
  PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_1c,(PType *)this,-0x80000000);
  PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  pPVar1 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
  local_20.Index = 0x23b;
  PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_20,(PType *)this,0x7fffffff);
  PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  return;
}

Assistant:

PInt::PInt()
: PBasicType(4, 4), Unsigned(false)
{
	Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, -0x7FFFFFFF - 1));
	Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this,  0x7FFFFFFF));
}